

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageAdd(StackInterpreter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar4;
  SmallIntegerValue SVar5;
  SmallIntegerValue SVar6;
  Oop object;
  double dVar7;
  double dVar8;
  double fb;
  double fa;
  int cb;
  int ca;
  SmallIntegerValue ib;
  SmallIntegerValue ia;
  Oop b;
  Oop a;
  StackInterpreter *this_local;
  
  paVar4 = &stackOopAt(this,1)->field_0;
  b.field_0 = *paVar4;
  paVar4 = &stackOopAt(this,0)->field_0;
  ia = paVar4->intValue;
  bVar1 = Oop::isSmallInteger(&b);
  if ((bVar1) && (bVar1 = Oop::isSmallInteger((Oop *)&ia), bVar1)) {
    fetchNextInstructionOpcode(this);
    popMultiplesOops(this,2);
    SVar5 = Oop::decodeSmallInteger(&b);
    SVar6 = Oop::decodeSmallInteger((Oop *)&ia);
    pushIntegerObject(this,SVar5 + SVar6);
  }
  else {
    bVar1 = Oop::isCharacter(&b);
    if ((bVar1) && (bVar1 = Oop::isCharacter((Oop *)&ia), bVar1)) {
      fetchNextInstructionOpcode(this);
      popMultiplesOops(this,2);
      iVar2 = Oop::decodeCharacter(&b);
      iVar3 = Oop::decodeCharacter((Oop *)&ia);
      object = Oop::encodeCharacter(iVar2 + iVar3);
      pushOop(this,object);
    }
    else {
      bVar1 = Oop::isFloatOrInt(&b);
      if ((bVar1) && (bVar1 = Oop::isFloatOrInt((Oop *)&ia), bVar1)) {
        fetchNextInstructionOpcode(this);
        popMultiplesOops(this,2);
        dVar7 = Oop::decodeFloatOrInt(&b);
        dVar8 = Oop::decodeFloatOrInt((Oop *)&ia);
        pushFloatObject(this,dVar7 + dVar8);
      }
      else {
        sendSpecialArgumentCount(this,Add,1);
      }
    }
  }
  return;
}

Assistant:

void interpretSpecialMessageAdd()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushIntegerObject(ia + ib);
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushOop(Oop::encodeCharacter(ca + cb));
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushFloatObject(fa + fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::Add, 1);
        }
    }